

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdmainct.h
# Opt level: O0

void set_wraparound_pointers(j_decompress_ptr cinfo)

{
  int iVar1;
  jpeg_d_main_controller *pjVar2;
  long lVar3;
  long lVar4;
  int iVar5;
  JSAMPARRAY xbuf1;
  JSAMPARRAY xbuf0;
  jpeg_component_info *compptr;
  int M;
  int rgroup;
  int i;
  int ci;
  my_main_ptr_conflict main_ptr;
  j_decompress_ptr cinfo_local;
  
  pjVar2 = cinfo->main;
  iVar1 = cinfo->min_DCT_scaled_size;
  ci = 0;
  compptr = cinfo->comp_info;
  for (; ci < cinfo->num_components; ci = ci + 1) {
    iVar5 = (compptr->v_samp_factor * compptr->DCT_scaled_size) / cinfo->min_DCT_scaled_size;
    lVar3 = *(long *)(pjVar2[6].process_data + (long)ci * 8);
    lVar4 = *(long *)(pjVar2[7].start_pass + (long)ci * 8);
    for (i = 0; i < iVar5; i = i + 1) {
      *(undefined8 *)(lVar3 + (long)(i - iVar5) * 8) =
           *(undefined8 *)(lVar3 + (long)(iVar5 * (iVar1 + 1) + i) * 8);
      *(undefined8 *)(lVar4 + (long)(i - iVar5) * 8) =
           *(undefined8 *)(lVar4 + (long)(iVar5 * (iVar1 + 1) + i) * 8);
      *(undefined8 *)(lVar3 + (long)(iVar5 * (iVar1 + 2) + i) * 8) =
           *(undefined8 *)(lVar3 + (long)i * 8);
      *(undefined8 *)(lVar4 + (long)(iVar5 * (iVar1 + 2) + i) * 8) =
           *(undefined8 *)(lVar4 + (long)i * 8);
    }
    compptr = compptr + 1;
  }
  return;
}

Assistant:

set_wraparound_pointers(j_decompress_ptr cinfo)
/* Set up the "wraparound" pointers at top and bottom of the pointer lists.
 * This changes the pointer list state from top-of-image to the normal state.
 */
{
  my_main_ptr main_ptr = (my_main_ptr)cinfo->main;
  int ci, i, rgroup;
  int M = cinfo->_min_DCT_scaled_size;
  jpeg_component_info *compptr;
  JSAMPARRAY xbuf0, xbuf1;

  for (ci = 0, compptr = cinfo->comp_info; ci < cinfo->num_components;
       ci++, compptr++) {
    rgroup = (compptr->v_samp_factor * compptr->_DCT_scaled_size) /
      cinfo->_min_DCT_scaled_size; /* height of a row group of component */
    xbuf0 = main_ptr->xbuffer[0][ci];
    xbuf1 = main_ptr->xbuffer[1][ci];
    for (i = 0; i < rgroup; i++) {
      xbuf0[i - rgroup] = xbuf0[rgroup * (M + 1) + i];
      xbuf1[i - rgroup] = xbuf1[rgroup * (M + 1) + i];
      xbuf0[rgroup * (M + 2) + i] = xbuf0[i];
      xbuf1[rgroup * (M + 2) + i] = xbuf1[i];
    }
  }
}